

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkAssignmentToItself(CheckerVisitor *this,BinExpr *expr)

{
  bool bVar1;
  TreeOp TVar2;
  NodeEqualChecker *this_00;
  Node *lhs;
  Node *rhs;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *rr;
  Expr *ll;
  Expr *r;
  Expr *l;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = (NodeEqualChecker *)BinExpr::lhs(in_RSI);
    lhs = &BinExpr::rhs(in_RSI)->super_Node;
    TVar2 = Node::op((Node *)in_RSI);
    if (TVar2 == TO_ASSIGN) {
      rhs = &deparen((Expr *)in_RDI)->super_Node;
      deparen((Expr *)in_RDI);
      bVar1 = NodeEqualChecker::check(this_00,lhs,rhs);
      if (bVar1) {
        report(in_RDI,(Node *)in_RSI,0x40);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkAssignmentToItself(const BinExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (expr->op() == TO_ASSIGN) {
    auto *ll = deparen(l);
    auto *rr = deparen(r);

    if (_equalChecker.check(ll, rr)) {
      report(expr, DiagnosticsId::DI_ASG_TO_ITSELF);
    }
  }
}